

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstractitemmodel.cpp
# Opt level: O1

int __thiscall QAbstractItemModel::qt_metacall(QAbstractItemModel *this,Call _c,int _id,void **_a)

{
  int _id_00;
  
  _id_00 = QObject::qt_metacall((QObject *)this,_c,_id,_a);
  if (-1 < _id_00) {
    if (_c == InvokeMetaMethod) {
      if (_id_00 < 0x48) {
        qt_static_metacall((QObject *)this,InvokeMetaMethod,_id_00,_a);
      }
      _id_00 = _id_00 + -0x48;
    }
    if (_c == RegisterMethodArgumentMetaType) {
      if (_id_00 < 0x48) {
        qt_static_metacall((QObject *)this,RegisterMethodArgumentMetaType,_id_00,_a);
      }
      _id_00 = _id_00 + -0x48;
    }
  }
  return _id_00;
}

Assistant:

int QAbstractItemModel::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QObject::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 72)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 72;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 72)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 72;
    }
    return _id;
}